

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  _anonymous_namespace_ *this_00;
  ostream *poVar4;
  size_t sVar5;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  Colour colour_2;
  Colour colour;
  string qualify_assertions_failed;
  Colour colour_1;
  char local_102 [2];
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  char local_e8 [16];
  string local_d8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a8 [8];
  char local_a0 [16];
  string local_90;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined2 local_38;
  
  poVar4 = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  sVar3 = (_testRunStats->totals).testCases.failed;
  sVar5 = (_testRunStats->totals).testCases.passed + sVar3 +
          (_testRunStats->totals).testCases.failedButOk;
  if (sVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"No tests ran.",0xd);
  }
  else if (sVar3 == sVar5) {
    local_102[1] = 0;
    Colour::use(BrightRed);
    this_00 = (_anonymous_namespace_ *)(_testRunStats->totals).assertions.failed;
    if (this_00 ==
        this_00 + (_testRunStats->totals).assertions.failedButOk +
                  (_testRunStats->totals).assertions.passed) {
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_(&local_d8,this_00,count);
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity =
           local_d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed ",7);
    ::(anonymous_namespace)::bothOrAll_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)(_testRunStats->totals).testCases.failed,count_01)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
    local_100 = (undefined1  [8])(_testRunStats->totals).testCases.failed;
    local_60 = 0x7361632074736574;
    local_58 = 0x65;
    local_68 = 9;
    local_f8._M_p = local_e8;
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f8,&local_60,(long)&local_58 + 1);
    operator<<(poVar4,(pluralise *)local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", failed ",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    local_b8 = (undefined1  [8])(_testRunStats->totals).assertions.failed;
    local_40 = 0x6f69747265737361;
    local_38 = 0x6e;
    local_48 = 9;
    local_b0._M_p = local_a0;
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,&local_40,(long)&local_38 + 1);
    operator<<(poVar4,(pluralise *)local_b8);
    local_102[0] = '.';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_102,1);
    if (local_b0._M_p != local_a0) {
      operator_delete(local_b0._M_p);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    Colour::use(None);
  }
  else {
    sVar3 = (_testRunStats->totals).assertions.failed;
    if ((_testRunStats->totals).assertions.passed + sVar3 +
        (_testRunStats->totals).assertions.failedButOk == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Passed ",7);
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                ((string *)local_b8,
                 (_anonymous_namespace_ *)
                 ((_testRunStats->totals).testCases.failed +
                  (_testRunStats->totals).testCases.passed +
                 (_testRunStats->totals).testCases.failedButOk),count_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_b8,(long)local_b0._M_p);
      local_100 = (undefined1  [8])
                  ((_testRunStats->totals).testCases.failed +
                   (_testRunStats->totals).testCases.passed +
                  (_testRunStats->totals).testCases.failedButOk);
      paVar1 = &local_d8.field_2;
      local_d8.field_2._M_allocated_capacity = 0x7361632074736574;
      local_d8.field_2._8_2_ = 0x65;
      local_d8._M_string_length = 9;
      local_f8._M_p = local_e8;
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,paVar1,(undefined1 *)((long)&local_d8.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (no assertions).",0x11);
      if (local_f8._M_p != local_e8) {
        operator_delete(local_f8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_b8 != (undefined1  [8])local_a8) {
        operator_delete((void *)local_b8);
      }
    }
    else if (sVar3 == 0) {
      local_102[0] = '\0';
      Colour::use(BrightGreen);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Passed ",7);
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                (&local_d8,(_anonymous_namespace_ *)(_testRunStats->totals).testCases.passed,
                 count_02);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      local_100 = (undefined1  [8])(_testRunStats->totals).testCases.passed;
      paVar1 = &local_90.field_2;
      local_90.field_2._M_allocated_capacity = 0x7361632074736574;
      local_90.field_2._8_2_ = 0x65;
      local_90._M_string_length = 9;
      local_f8._M_p = local_e8;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,paVar1,(undefined1 *)((long)&local_90.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," with ",6);
      local_b8 = (undefined1  [8])(_testRunStats->totals).assertions.passed;
      local_60 = 0x6f69747265737361;
      local_58 = 0x6e;
      local_68 = 9;
      local_b0._M_p = local_a0;
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,&local_60,(long)&local_58 + 1);
      operator<<(poVar4,(pluralise *)local_b8);
      local_50 = (undefined8 *)CONCAT71(local_50._1_7_,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_50,1);
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_f8._M_p != local_e8) {
        operator_delete(local_f8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      Colour::use(None);
    }
    else {
      local_50 = (undefined8 *)((ulong)local_50 & 0xffffffffffffff00);
      Colour::use(BrightRed);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed ",7);
      local_100 = (undefined1  [8])(_testRunStats->totals).testCases.failed;
      paVar1 = &local_d8.field_2;
      local_d8.field_2._M_allocated_capacity = 0x7361632074736574;
      local_d8.field_2._8_2_ = 0x65;
      local_d8._M_string_length = 9;
      local_f8._M_p = local_e8;
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,paVar1,(undefined1 *)((long)&local_d8.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", failed ",9);
      local_b8 = (undefined1  [8])(_testRunStats->totals).assertions.failed;
      paVar2 = &local_90.field_2;
      local_90.field_2._M_allocated_capacity = 0x6f69747265737361;
      local_90.field_2._8_2_ = 0x6e;
      local_90._M_string_length = 9;
      local_b0._M_p = local_a0;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,paVar2,(undefined1 *)((long)&local_90.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_b8);
      local_70 = (undefined8 *)CONCAT71(local_70._1_7_,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_f8._M_p != local_e8) {
        operator_delete(local_f8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      Colour::use(None);
    }
  }
  local_100[0] = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,local_100,1
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  StreamingReporterBase<Catch::CompactReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::CompactReporter>,_testRunStats);
  return;
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( stream, _testRunStats.totals );
            stream << '\n' << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }